

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bro.cpp
# Opt level: O2

void __thiscall bro::bro(bro *this,int argc,char **argv)

{
  long lVar1;
  long lVar2;
  brotli_decoder dec;
  args_t args;
  ifstream ifs;
  int local_e08;
  byte abStack_df0 [488];
  brotli_decoder_state state;
  
  args_t::args_t(&args,argc,argv);
  if (args.fail == false) {
    std::ifstream::ifstream(&ifs);
    if (args.input_file != (char *)0x0) {
      std::ifstream::open((char *)&ifs,(_Ios_Openmode)args.input_file);
    }
    state.max_backward_distance = 0;
    state.dest_max = (char *)0x0;
    state.log_file = (FILE *)0x0;
    state.src = (char *)0x0;
    state.bitptr = 0;
    state.bitptr_max = 0;
    state.dest = (char *)0x0;
    state.bytes_written = 0;
    state.ring_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    state.ring_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    state.ring_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((abStack_df0[*(long *)(_ifs + -0x18)] & 3) == 0) {
      lVar1 = std::chrono::_V2::system_clock::now();
      std::istream::read((char *)&ifs,0x12b1b0);
      state.src = bro::tmp;
      state._16_8_ = (ulong)(uint)(local_e08 << 3) << 0x20;
      state.log_file = (FILE *)fopen("log.txt","wb");
      andyzip::brotli_decoder::decode(&dec,&state);
      lVar2 = std::chrono::_V2::system_clock::now();
      printf("err=%d\n",(ulong)state.error);
      printf("%d\n",state.bytes_written & 0xffffffff);
      if (args.verbose == true) {
        printf("Brotli decompression speed: %0.f MB/s\n",
               ((((double)CONCAT44(0x45300000,(int)(state.bytes_written >> 0x20)) -
                 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)state.bytes_written) - 4503599627370496.0)) *
               953.67431640625) / (double)(lVar2 - lVar1));
      }
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&state.ring_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
    ;
    std::ifstream::~ifstream(&ifs);
  }
  return;
}

Assistant:

bro(int argc, const char **argv) {
    args_t args(argc, argv);
    if (args.fail) return;

    #ifdef MSC_VER
      _setmode(_fileno(stdin), _O_BINARY);
      _setmode(_fileno(stdout), _O_BINARY);
    #endif

    std::ifstream ifs;
    if (args.input_file) {
      ifs.open(args.input_file, std::ios::binary);
    }

    std::istream &is = args.input_file ? static_cast<std::istream&>(ifs) : std::cin;
    
    //std::ostream os = !args.output_file ? std::cout : (std::ostream&)std::ofstream(args.output_file, std::ios::binary);

    andyzip::brotli_decoder dec;

    andyzip::brotli_decoder_state state;

    static char tmp[0x1000000];
    if (!ifs.bad() && !ifs.eof()) {
      auto start = std::chrono::high_resolution_clock::now();
      ifs.read(tmp, sizeof(tmp));
      state.src = tmp;
      state.bitptr = 0;
      state.bitptr_max = (std::uint32_t)(ifs.gcount() * 8);
      state.log_file = fopen("log.txt", "wb");
      dec.decode(state);
      auto end = std::chrono::high_resolution_clock::now();
      auto nanoseconds = std::chrono::duration_cast<std::chrono::nanoseconds>(end - start);
      printf("err=%d\n", (int)state.error);
      printf("%d\n", (int)state.bytes_written);
      if (args.verbose) {
        printf("Brotli decompression speed: %0.f MB/s\n", (1000000000.0/1024/1024) * state.bytes_written / nanoseconds.count());
      }
    }
  }